

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QRhiResource*,std::pair<int,bool>>::emplace<std::pair<int,bool>const&>
          (QHash<QRhiResource*,std::pair<int,bool>> *this,QRhiResource **key,pair<int,_bool> *args)

{
  pair<int,_bool> pVar1;
  Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  pair<int,_bool> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pVar1 = *(pair<int,_bool> *)this;
  if (pVar1 != (pair<int,_bool>)0x0) {
    if (*(uint *)pVar1 < 2) {
      if (*(ulong *)((long)pVar1 + 8) < *(ulong *)((long)pVar1 + 0x10) >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<std::pair<int,bool>const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.second = args->second;
        local_28.first = args->first;
        pVar3 = (piter)emplace_helper<std::pair<int,bool>>(this,key,&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_00587167;
    }
    if ((pVar1 != (pair<int,_bool>)0x0) && (*(uint *)pVar1 != 0xffffffff)) {
      LOCK();
      *(uint *)pVar1 = *(uint *)pVar1 + 1;
      UNLOCK();
    }
  }
  pDVar2 = *(Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> **)this;
  local_28 = pVar1;
  if ((pDVar2 == (Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> *)0x0) ||
     (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar2 = QHashPrivate::Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_>::
             detached(pDVar2);
    *(Data<QHashPrivate::Node<QRhiResource_*,_std::pair<int,_bool>_>_> **)this = pDVar2;
  }
  pVar3 = (piter)emplace_helper<std::pair<int,bool>const&>(this,key,args);
  QHash<QRhiResource_*,_std::pair<int,_bool>_>::~QHash
            ((QHash<QRhiResource_*,_std::pair<int,_bool>_> *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00587167:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }